

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O1

void __thiscall JSON::JSON_number::JSON_number(JSON_number *this,longlong value)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  uint __len;
  ulong __val;
  
  (this->super_JSON_value).type_code = vt_number;
  (this->super_JSON_value)._vptr_JSON_value = (_func_int **)&PTR__JSON_number_002ede48;
  __val = -value;
  if (0 < value) {
    __val = value;
  }
  __len = 1;
  if (9 < __val) {
    uVar3 = __val;
    uVar2 = 4;
    do {
      __len = uVar2;
      if (uVar3 < 100) {
        __len = __len - 2;
        goto LAB_00121751;
      }
      if (uVar3 < 1000) {
        __len = __len - 1;
        goto LAB_00121751;
      }
      if (uVar3 < 10000) goto LAB_00121751;
      bVar1 = 99999 < uVar3;
      uVar3 = uVar3 / 10000;
      uVar2 = __len + 4;
    } while (bVar1);
    __len = __len + 1;
  }
LAB_00121751:
  (this->encoded)._M_dataplus._M_p = (pointer)&(this->encoded).field_2;
  std::__cxx11::string::_M_construct((ulong)&this->encoded,(char)__len - (char)(value >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long_long>
            ((this->encoded)._M_dataplus._M_p + -(value >> 0x3f),__len,__val);
  return;
}

Assistant:

JSON::JSON_number::JSON_number(long long value) :
    JSON_value(vt_number),
    encoded(std::to_string(value))
{
}